

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall SimpleASTNode::print(SimpleASTNode *this,int level)

{
  undefined8 uVar1;
  ostream *poVar2;
  int iVar3;
  _List_node_base *p_Var4;
  char *local_50;
  long local_48;
  undefined4 local_40;
  undefined2 uStack_3c;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined2 uStack_34;
  undefined1 local_32;
  
  if (level == 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  if (0 < level) {
    iVar3 = level;
    do {
      local_50 = (char *)CONCAT71(local_50._1_7_,9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_50,1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  switch(this->m_type) {
  case DECLARATION:
    uVar1 = 0x64726f572079654b;
    goto LAB_00107f09;
  case INT_LITERAL:
    local_40 = 0x20746e49;
    uStack_3c = 0x694c;
    uStack_3a = 0x74;
    uStack_38 = 0x72;
    uStack_37 = 0x61;
    uStack_36 = 0x6c;
    goto LAB_00107f72;
  case ID:
    local_40 = 0x69726156;
    uStack_3c = 0x6261;
    uStack_3a = 0x6c;
    uStack_38 = 0x20;
    uStack_37 = 0x49;
    uStack_36 = 0x44;
LAB_00107f72:
    uStack_39 = 0x65;
    local_48 = 0xb;
    uStack_35 = 0;
    break;
  case ASSIGMENT:
    local_40 = 0x69737341;
    uStack_3c = 0x6e67;
    uStack_3a = 0x6d;
    uStack_39 = 0x65;
    uStack_38 = 0x6e;
    uStack_37 = 0x74;
    local_48 = 10;
    uStack_36 = 0;
    break;
  case ADDITIVE_EXP:
    uVar1 = 0x6576697469646441;
LAB_00107f09:
    local_40 = (undefined4)uVar1;
    uStack_3c = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_3a = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_39 = (undefined1)((ulong)uVar1 >> 0x38);
    local_48 = 8;
    uStack_38 = 0;
    break;
  case MULTIL_EXP:
    uStack_38 = 99;
    uStack_37 = 0x61;
    uStack_36 = 0x74;
    uStack_35 = 0x69;
    uStack_34 = 0x6576;
    local_40 = 0x746c754d;
    uStack_3c = 0x7069;
    uStack_3a = 0x6c;
    uStack_39 = 0x69;
    local_48 = 0xe;
    local_32 = 0;
    break;
  default:
    uStack_3c = 0x6c75;
    uStack_3a = 0x74;
    local_40 = 0x61666544;
    local_48 = 7;
    uStack_39 = 0;
  }
  local_50 = (char *)&local_40;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)&local_40,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->m_text)._M_dataplus._M_p,(this->m_text)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_50 != (char *)&local_40) {
    operator_delete(local_50);
  }
  p_Var4 = (this->m_childList).
           super__List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)&this->m_childList) {
    do {
      print((SimpleASTNode *)p_Var4[1]._M_next,level + 1);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&this->m_childList);
  }
  return;
}

Assistant:

void SimpleASTNode::print(int level)
{
    if (!level)
        std::cout << std::endl;
    for (int i = 0; i < level; i++)
        std::cout << '\t';
    std::cout << syntaxType(m_type) << " : " << m_text << std::endl;
    for (auto& item : m_childList) {
        item->print(level + 1);
    }
}